

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::Region3::delta2_d2phi_ddelta2(Region3 *this,double T,double rho)

{
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  bool bVar4;
  uint uVar5;
  size_t i;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pdVar3 = (this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar7 = -*pdVar3;
  lVar6 = 1;
  do {
    uVar1 = (this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar6];
    dVar8 = 1.0;
    if (uVar1 != 0) {
      uVar2 = -uVar1;
      if (0 < (int)uVar1) {
        uVar2 = uVar1;
      }
      dVar9 = 1.0 / (rho / 322.0);
      if (-1 < (int)uVar1) {
        dVar9 = rho / 322.0;
      }
      dVar8 = 1.0;
      do {
        if ((uVar2 & 1) != 0) {
          dVar8 = dVar8 * dVar9;
        }
        dVar9 = dVar9 * dVar9;
        bVar4 = 1 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar4);
    }
    uVar2 = (this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar6];
    dVar9 = 1.0;
    if (uVar2 != 0) {
      uVar5 = -uVar2;
      if (0 < (int)uVar2) {
        uVar5 = uVar2;
      }
      dVar10 = 1.0 / (647.096 / T);
      if (-1 < (int)uVar2) {
        dVar10 = 647.096 / T;
      }
      dVar9 = 1.0;
      do {
        if ((uVar5 & 1) != 0) {
          dVar9 = dVar9 * dVar10;
        }
        dVar10 = dVar10 * dVar10;
        bVar4 = 1 < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar4);
    }
    dVar7 = dVar7 + (double)(int)(uVar1 - 1) * (double)(int)uVar1 * pdVar3[lVar6] * dVar8 * dVar9;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x28);
  return dVar7;
}

Assistant:

double delta2_d2phi_ddelta2(double T, double rho) const{
            const double delta = rho/Rhocrit, tau = Tcrit/T;
            double summer = -nr[0];
            for (std::size_t i = 1; i < 40; ++i){
                summer += nr[i]*Ir[i]*(Ir[i]-1)*powi(delta, Ir[i])*powi(tau, Jr[i]);
            }
            return summer;
        }